

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall embree::Texture::Texture(Texture *this,Ref<embree::Image> *img,string *fileName)

{
  bool bVar1;
  void *pvVar2;
  string *in_RDX;
  long *in_RSI;
  uint *in_RDI;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  uint local_68;
  uint local_64;
  Image *in_stack_ffffffffffffffc0;
  
  *in_RDI = (uint)*(undefined8 *)(*in_RSI + 0x10);
  in_RDI[1] = (uint)*(undefined8 *)(*in_RSI + 0x18);
  in_RDI[2] = 1;
  in_RDI[3] = 4;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RDX);
  bVar1 = isPowerOf2(*in_RDI);
  if (bVar1) {
    local_64 = *in_RDI - 1;
  }
  else {
    local_64 = 0;
  }
  in_RDI[4] = local_64;
  bVar1 = isPowerOf2(in_RDI[1]);
  if (bVar1) {
    local_68 = in_RDI[1] - 1;
  }
  else {
    local_68 = 0;
  }
  in_RDI[5] = local_68;
  pvVar2 = alignedUSMMalloc(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,DEFAULT);
  *(void **)(in_RDI + 6) = pvVar2;
  Image::convertToRGBA8(in_stack_ffffffffffffffc0,(uchar *)in_RDI);
  return;
}

Assistant:

Texture::Texture(Ref<Image> img, const std::string fileName)
    : width(unsigned(img->width)), height(unsigned(img->height)), format(RGBA8), bytesPerTexel(4), width_mask(0), height_mask(0), data(nullptr), fileName(fileName)
  {
    width_mask  = isPowerOf2(width) ? width-1 : 0;
    height_mask = isPowerOf2(height) ? height-1 : 0;

    data = alignedUSMMalloc(4*width*height,16);
    img->convertToRGBA8((unsigned char*)data);
  }